

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O0

void __thiscall OrPattern::saveXml(OrPattern *this,ostream *s)

{
  size_type sVar1;
  const_reference ppDVar2;
  int local_1c;
  int4 i;
  ostream *s_local;
  OrPattern *this_local;
  
  std::operator<<(s,"<or_pat>\n");
  local_1c = 0;
  while( true ) {
    sVar1 = std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::size(&this->orlist);
    if (sVar1 <= (ulong)(long)local_1c) break;
    ppDVar2 = std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::operator[]
                        (&this->orlist,(long)local_1c);
    (*((*ppDVar2)->super_Pattern)._vptr_Pattern[0xd])(*ppDVar2,s);
    local_1c = local_1c + 1;
  }
  std::operator<<(s,"</or_pat>\n");
  return;
}

Assistant:

void OrPattern::saveXml(ostream &s) const

{
  s << "<or_pat>\n";
  for(int4 i=0;i<orlist.size();++i)
    orlist[i]->saveXml(s);
  s << "</or_pat>\n";
}